

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmanvector.h
# Opt level: O2

void __thiscall
TPZManVector<TPZManVector<double,_3>,_4>::Resize
          (TPZManVector<TPZManVector<double,_3>,_4> *this,int64_t newsize,
          TPZManVector<double,_3> *object)

{
  undefined1 *puVar1;
  undefined1 auVar2 [16];
  ostream *poVar3;
  ulong uVar4;
  ulong *puVar5;
  TPZManVector<double,_3> *pTVar6;
  long lVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  TPZManVector<double,_3> *pTVar11;
  long lVar12;
  double dVar13;
  
  if (-1 < newsize) {
    lVar7 = (this->super_TPZVec<TPZManVector<double,_3>_>).fNElements;
    if (lVar7 != newsize) {
      lVar9 = (this->super_TPZVec<TPZManVector<double,_3>_>).fNAlloc;
      if (lVar9 < newsize) {
        if ((ulong)newsize < 5) {
          puVar1 = &this->field_0x20;
          lVar9 = 0;
          for (lVar12 = 0; lVar12 < lVar7; lVar12 = lVar12 + 1) {
            TPZManVector<double,_3>::operator=
                      ((TPZManVector<double,_3> *)(puVar1 + lVar9),
                       (TPZManVector<double,_3> *)
                       ((long)((this->super_TPZVec<TPZManVector<double,_3>_>).fStore)->fExtAlloc +
                       lVar9 + -0x20));
            lVar7 = (this->super_TPZVec<TPZManVector<double,_3>_>).fNElements;
            lVar9 = lVar9 + 0x38;
          }
          lVar7 = lVar12;
          if (lVar12 < newsize) {
            lVar7 = newsize;
          }
          pTVar11 = (TPZManVector<double,_3> *)(puVar1 + lVar9);
          for (; lVar12 != lVar7; lVar7 = lVar7 + -1) {
            TPZManVector<double,_3>::operator=(pTVar11,object);
            pTVar11 = pTVar11 + 1;
          }
          pTVar11 = (this->super_TPZVec<TPZManVector<double,_3>_>).fStore;
          if (pTVar11 != (TPZManVector<double,_3> *)0x0 &&
              pTVar11 != (TPZManVector<double,_3> *)puVar1) {
            dVar13 = pTVar11[-1].fExtAlloc[2];
            if (dVar13 != 0.0) {
              lVar7 = (long)dVar13 * 0x38;
              do {
                TPZManVector<double,_3>::~TPZManVector
                          ((TPZManVector<double,_3> *)((long)pTVar11[-1].fExtAlloc + lVar7 + -0x20))
                ;
                lVar7 = lVar7 + -0x38;
              } while (lVar7 != 0);
            }
            operator_delete__(pTVar11[-1].fExtAlloc + 2,(long)dVar13 * 0x38 + 8);
          }
          (this->super_TPZVec<TPZManVector<double,_3>_>).fStore = (TPZManVector<double,_3> *)puVar1;
          (this->super_TPZVec<TPZManVector<double,_3>_>).fNElements = newsize;
          (this->super_TPZVec<TPZManVector<double,_3>_>).fNAlloc = 4;
        }
        else {
          dVar13 = (double)lVar9 * 1.2;
          uVar10 = (long)dVar13;
          if (dVar13 < (double)newsize) {
            uVar10 = newsize;
          }
          auVar2._8_8_ = 0;
          auVar2._0_8_ = uVar10;
          uVar4 = SUB168(auVar2 * ZEXT816(0x38),0);
          uVar8 = uVar4 + 8;
          if (0xfffffffffffffff7 < uVar4) {
            uVar8 = 0xffffffffffffffff;
          }
          if (SUB168(auVar2 * ZEXT816(0x38),8) != 0) {
            uVar8 = 0xffffffffffffffff;
          }
          puVar5 = (ulong *)operator_new__(uVar8);
          *puVar5 = uVar10;
          pTVar11 = (TPZManVector<double,_3> *)(puVar5 + 1);
          if (uVar10 != 0) {
            lVar7 = 0;
            pTVar6 = pTVar11;
            do {
              TPZManVector<double,_3>::TPZManVector(pTVar6,0);
              lVar7 = lVar7 + -0x38;
              pTVar6 = pTVar6 + 1;
            } while (uVar10 * -0x38 - lVar7 != 0);
          }
          lVar9 = 0;
          for (lVar7 = 0; lVar7 < (this->super_TPZVec<TPZManVector<double,_3>_>).fNElements;
              lVar7 = lVar7 + 1) {
            TPZManVector<double,_3>::operator=
                      ((TPZManVector<double,_3> *)((long)pTVar11->fExtAlloc + lVar9 + -0x20),
                       (TPZManVector<double,_3> *)
                       ((long)((this->super_TPZVec<TPZManVector<double,_3>_>).fStore)->fExtAlloc +
                       lVar9 + -0x20));
            lVar9 = lVar9 + 0x38;
          }
          lVar12 = lVar7;
          if (lVar7 < newsize) {
            lVar12 = newsize;
          }
          pTVar6 = (TPZManVector<double,_3> *)((long)pTVar11->fExtAlloc + lVar9 + -0x20);
          for (; lVar7 != lVar12; lVar12 = lVar12 + -1) {
            TPZManVector<double,_3>::operator=(pTVar6,object);
            pTVar6 = pTVar6 + 1;
          }
          pTVar6 = (this->super_TPZVec<TPZManVector<double,_3>_>).fStore;
          if (pTVar6 != (TPZManVector<double,_3> *)0x0 &&
              pTVar6 != (TPZManVector<double,_3> *)&this->field_0x20) {
            dVar13 = pTVar6[-1].fExtAlloc[2];
            if (dVar13 != 0.0) {
              lVar7 = (long)dVar13 * 0x38;
              do {
                TPZManVector<double,_3>::~TPZManVector
                          ((TPZManVector<double,_3> *)((long)pTVar6[-1].fExtAlloc + lVar7 + -0x20));
                lVar7 = lVar7 + -0x38;
              } while (lVar7 != 0);
            }
            operator_delete__(pTVar6[-1].fExtAlloc + 2,(long)dVar13 * 0x38 + 8);
          }
          (this->super_TPZVec<TPZManVector<double,_3>_>).fStore = pTVar11;
          (this->super_TPZVec<TPZManVector<double,_3>_>).fNElements = newsize;
          (this->super_TPZVec<TPZManVector<double,_3>_>).fNAlloc = uVar10;
        }
      }
      else {
        lVar9 = lVar7 * 0x38;
        for (; lVar7 < newsize; lVar7 = lVar7 + 1) {
          TPZManVector<double,_3>::operator=
                    ((TPZManVector<double,_3> *)
                     ((long)((this->super_TPZVec<TPZManVector<double,_3>_>).fStore)->fExtAlloc +
                     lVar9 + -0x20),object);
          lVar9 = lVar9 + 0x38;
        }
        (this->super_TPZVec<TPZManVector<double,_3>_>).fNElements = newsize;
      }
    }
    return;
  }
  poVar3 = std::operator<<((ostream *)&std::cerr,"TManVec::Resize. Bad parameter newsize.");
  std::endl<char,std::char_traits<char>>(poVar3);
  std::ostream::flush();
  return;
}

Assistant:

void TPZManVector< T, NumExtAlloc >::Resize(const int64_t newsize, const T& object) {
#ifndef PZNODEBUG
    if (newsize < 0) {
        PZError << "TManVec::Resize. Bad parameter newsize." << std::endl;
        PZError.flush();
        return;
    }
    if (newsize == this->fNElements)
        return;
#endif

    if (newsize <= this->fNAlloc) {
        for (int64_t i = this->fNElements; i < newsize; i++)
            this->fStore[i] = object;

        this->fNElements = newsize;
    } else if (newsize <= NumExtAlloc) { // that is, fExtAlloc != this->fStore. Moreover : this->fNElements <= this->fNAlloc
        // <= NumExtAlloc

        int64_t i;

        for (i = 0L; i < this->fNElements; i++) {
            fExtAlloc[i] = this->fStore[i];
        }

        for (; i < newsize; i++)
            fExtAlloc[i] = object;

        if (this->fStore != fExtAlloc) delete [] this->fStore;

        this->fStore = fExtAlloc;
        this->fNElements = newsize;
        this->fNAlloc = NumExtAlloc;
    } else { // the size is larger than the allocated memory, then this->fNElements
        // is always lower than newsize because fNElemets <=this->fNAllocs
        int64_t i, realsize = ExpandSize(newsize);

        T* newstore = new T[realsize];

        for (i = 0L; i < this->fNElements; i++) {
            newstore[i] = this->fStore[i];
        }

        for (; i < newsize; i++)
            newstore[i] = object;

        if (this->fStore != fExtAlloc)
            delete[]this->fStore;

        this->fStore = newstore;
        this->fNElements = newsize;
        this->fNAlloc = realsize;
    }
}